

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeCommandListAppendWaitExternalSemaphoreExt
          (ze_command_list_handle_t hCommandList,uint32_t numSemaphores,
          ze_external_semaphore_ext_handle_t *phSemaphores,
          ze_external_semaphore_wait_params_ext_t *waitParams,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  ze_result_t zVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 local_50;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x328);
  if (pcVar1 == (code *)0x0) {
    return ZE_RESULT_ERROR_UNINITIALIZED;
  }
  uVar2 = *(undefined8 *)hCommandList;
  pvVar4 = operator_new__((ulong)numSemaphores * 8);
  if (numSemaphores != 0 && phSemaphores != (ze_external_semaphore_ext_handle_t *)0x0) {
    uVar6 = 1;
    do {
      *(undefined8 *)((long)pvVar4 + uVar6 * 8 + -8) = *(undefined8 *)phSemaphores[uVar6 - 1];
      if (phSemaphores == (ze_external_semaphore_ext_handle_t *)0x0) break;
      bVar7 = uVar6 < numSemaphores;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  if (hSignalEvent == (ze_event_handle_t)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = *(undefined8 *)hSignalEvent;
  }
  pvVar5 = operator_new__((ulong)numWaitEvents * 8);
  if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
    uVar6 = 1;
    do {
      *(undefined8 *)((long)pvVar5 + uVar6 * 8 + -8) = *(undefined8 *)phWaitEvents[uVar6 - 1];
      if (phWaitEvents == (ze_event_handle_t *)0x0) break;
      bVar7 = uVar6 < numWaitEvents;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  zVar3 = (*pcVar1)(uVar2,numSemaphores,pvVar4,waitParams,local_50,numWaitEvents,pvVar5);
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendWaitExternalSemaphoreExt(
        ze_command_list_handle_t hCommandList,          ///< [in] The command list handle.
        uint32_t numSemaphores,                         ///< [in] The number of external semaphores.
        ze_external_semaphore_ext_handle_t* phSemaphores,   ///< [in] [range(0,numSemaphores)] The vector of external semaphore handles
                                                        ///< to append into command list.
        ze_external_semaphore_wait_params_ext_t* waitParams,///< [in] Wait parameters.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendWaitExternalSemaphoreExt = dditable->ze.CommandList.pfnAppendWaitExternalSemaphoreExt;
        if( nullptr == pfnAppendWaitExternalSemaphoreExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handles to driver handles
        auto phSemaphoresLocal = new ze_external_semaphore_ext_handle_t [numSemaphores];
        for( size_t i = 0; ( nullptr != phSemaphores ) && ( i < numSemaphores ); ++i )
            phSemaphoresLocal[ i ] = reinterpret_cast<ze_external_semaphore_ext_object_t*>( phSemaphores[ i ] )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendWaitExternalSemaphoreExt( hCommandList, numSemaphores, phSemaphoresLocal, waitParams, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phSemaphoresLocal;
        delete []phWaitEventsLocal;

        return result;
    }